

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

ly_set * ly_ctx_find_path(ly_ctx *ctx,char *path)

{
  ly_set *plVar1;
  ly_set *local_18;
  ly_set *resultset;
  
  local_18 = (ly_set *)0x0;
  if (ctx == (ly_ctx *)0x0 || path == (char *)0x0) {
    plVar1 = (ly_set *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_ctx_find_path");
  }
  else {
    resolve_schema_nodeid(path,(lys_node *)0x0,*(ctx->models).list,&local_18,1,1);
    plVar1 = local_18;
  }
  return plVar1;
}

Assistant:

ly_set *
ly_ctx_find_path(struct ly_ctx *ctx, const char *path)
{
    struct ly_set *resultset = NULL;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    /* start in internal module without data to make sure that all the nodes are prefixed */
    resolve_schema_nodeid(path, NULL, ctx->models.list[0], &resultset, 1, 1);
    return resultset;
}